

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoPrintClasses(Gia_IsoMan_t *p)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  long lVar3;
  
  printf("The total of %d classes:\n",(ulong)(uint)(p->vClasses->nSize / 2));
  pVVar1 = p->vClasses;
  if (1 < pVVar1->nSize) {
    lVar3 = 1;
    uVar2 = 0;
    do {
      printf("%5d : (%3d,%3d)  ",(ulong)uVar2,(ulong)(uint)pVVar1->pArray[lVar3 + -1],
             (ulong)(uint)pVVar1->pArray[lVar3]);
      putchar(10);
      pVVar1 = p->vClasses;
      lVar3 = lVar3 + 2;
      uVar2 = uVar2 + 1;
    } while ((int)lVar3 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Gia_IsoPrintClasses( Gia_IsoMan_t * p )
{
    int fVerbose = 0;
    int i, k, iBegin, nSize;
    printf( "The total of %d classes:\n", Vec_IntSize(p->vClasses)/2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        printf( "%5d : (%3d,%3d)  ", i/2, iBegin, nSize );
        if ( fVerbose )
        {
            printf( "{" );
            for ( k = 0; k < nSize; k++ )
                printf( " %3d,%08x", Gia_IsoGetItem(p, iBegin+k), Gia_IsoGetValue(p, iBegin+k) );
            printf( " }" );
        }
        printf( "\n" );
    }
}